

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageQualifiersTests.cpp
# Opt level: O0

void __thiscall
vkt::image::anon_unknown_0::MemoryQualifierInstanceImage::prepareDescriptors
          (MemoryQualifierInstanceImage *this)

{
  VkDescriptorPool descriptorPool;
  RefData<vk::Handle<(vk::HandleType)21>_> data;
  RefData<vk::Handle<(vk::HandleType)19>_> data_00;
  RefData<vk::Handle<(vk::HandleType)22>_> data_01;
  DeviceInterface *vk;
  DeviceInterface *device_00;
  DescriptorPoolBuilder *this_00;
  DescriptorSetLayoutBuilder *this_01;
  Handle<(vk::HandleType)21> *pHVar1;
  Handle<(vk::HandleType)19> *pHVar2;
  Handle<(vk::HandleType)13> *pHVar3;
  Handle<(vk::HandleType)22> *pHVar4;
  DescriptorSetUpdateBuilder *this_02;
  Location local_1e0;
  VkDescriptorSet local_1d8;
  DescriptorSetUpdateBuilder local_1d0;
  deUint64 local_188;
  VkSampler local_180;
  undefined1 local_178 [8];
  VkDescriptorImageInfo descriptorImageInfo;
  Move<vk::Handle<(vk::HandleType)22>_> local_150;
  RefData<vk::Handle<(vk::HandleType)22>_> local_130;
  DescriptorSetLayoutBuilder local_110;
  Move<vk::Handle<(vk::HandleType)19>_> local_c8;
  RefData<vk::Handle<(vk::HandleType)19>_> local_a8;
  DescriptorPoolBuilder local_78;
  Move<vk::Handle<(vk::HandleType)21>_> local_60;
  RefData<vk::Handle<(vk::HandleType)21>_> local_40;
  DeviceInterface *local_20;
  DeviceInterface *deviceInterface;
  VkDevice device;
  MemoryQualifierInstanceImage *this_local;
  
  device = (VkDevice)this;
  deviceInterface =
       (DeviceInterface *)
       Context::getDevice((this->super_MemoryQualifierInstanceBase).super_TestInstance.m_context);
  local_20 = Context::getDeviceInterface
                       ((this->super_MemoryQualifierInstanceBase).super_TestInstance.m_context);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder(&local_78);
  this_00 = ::vk::DescriptorPoolBuilder::addType(&local_78,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
  ::vk::DescriptorPoolBuilder::build(&local_60,this_00,local_20,(VkDevice)deviceInterface,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_40,(Move *)&local_60);
  data.deleter.m_deviceIface = local_40.deleter.m_deviceIface;
  data.object.m_internal = local_40.object.m_internal;
  data.deleter.m_device = local_40.deleter.m_device;
  data.deleter.m_allocator = local_40.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::operator=
            (&(this->super_MemoryQualifierInstanceBase).m_descriptorPool,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_60);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder(&local_78);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_110);
  this_01 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (&local_110,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x20);
  ::vk::DescriptorSetLayoutBuilder::build(&local_c8,this_01,local_20,(VkDevice)deviceInterface,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_a8,(Move *)&local_c8);
  data_00.deleter.m_deviceIface = local_a8.deleter.m_deviceIface;
  data_00.object.m_internal = local_a8.object.m_internal;
  data_00.deleter.m_device = local_a8.deleter.m_device;
  data_00.deleter.m_allocator = local_a8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::operator=
            (&(this->super_MemoryQualifierInstanceBase).m_descriptorSetLayout,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_c8);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&local_110);
  device_00 = deviceInterface;
  vk = local_20;
  pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                     (&(this->super_MemoryQualifierInstanceBase).m_descriptorPool.
                       super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  descriptorPool.m_internal = pHVar1->m_internal;
  pHVar2 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                     (&(this->super_MemoryQualifierInstanceBase).m_descriptorSetLayout.
                       super_RefBase<vk::Handle<(vk::HandleType)19>_>);
  descriptorImageInfo._16_8_ = pHVar2->m_internal;
  makeDescriptorSet(&local_150,vk,(VkDevice)device_00,descriptorPool,
                    (VkDescriptorSetLayout)descriptorImageInfo._16_8_);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_130,(Move *)&local_150);
  data_01.deleter.m_deviceIface = local_130.deleter.m_deviceIface;
  data_01.object.m_internal = local_130.object.m_internal;
  data_01.deleter.m_device = local_130.deleter.m_device;
  data_01.deleter.m_pool.m_internal = local_130.deleter.m_pool.m_internal;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::operator=
            (&(this->super_MemoryQualifierInstanceBase).m_descriptorSet,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_150);
  ::vk::Handle<(vk::HandleType)20>::Handle(&local_180,0);
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                     (&(this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  local_188 = pHVar3->m_internal;
  ::vk::makeDescriptorImageInfo
            ((VkDescriptorImageInfo *)local_178,local_180,(VkImageView)local_188,
             VK_IMAGE_LAYOUT_GENERAL);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_1d0);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                     (&(this->super_MemoryQualifierInstanceBase).m_descriptorSet.
                       super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  local_1d8.m_internal = pHVar4->m_internal;
  local_1e0 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  this_02 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (&local_1d0,local_1d8,&local_1e0,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                       (VkDescriptorImageInfo *)local_178);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,local_20,(VkDevice)deviceInterface);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_1d0);
  return;
}

Assistant:

void MemoryQualifierInstanceImage::prepareDescriptors (void)
{
	const VkDevice			device			= m_context.getDevice();
	const DeviceInterface&	deviceInterface = m_context.getDeviceInterface();

	// Create descriptor pool
	m_descriptorPool =
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE)
		.build(deviceInterface, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

	// Create descriptor set layout
	m_descriptorSetLayout =
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(deviceInterface, device);

	// Allocate descriptor set
	m_descriptorSet = makeDescriptorSet(deviceInterface, device, *m_descriptorPool, *m_descriptorSetLayout);

	// Set the bindings
	const VkDescriptorImageInfo descriptorImageInfo = makeDescriptorImageInfo(DE_NULL, *m_imageView, VK_IMAGE_LAYOUT_GENERAL);

	DescriptorSetUpdateBuilder()
		.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descriptorImageInfo)
		.update(deviceInterface, device);
}